

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XPMPMultiplayer.cpp
# Opt level: O0

void XPMPRegisterPlaneNotifierFunc(XPMPPlaneNotifier_f inFunc,void *inRefcon)

{
  bool bVar1;
  iterator __last;
  iterator __val;
  iterator this;
  size_type sVar2;
  void *in_RSI;
  XPMPPlaneNotifier_f in_RDI;
  XPMPPlaneNotifierTy observer;
  list<XPMP2::XPMPPlaneNotifierTy,_std::allocator<XPMP2::XPMPPlaneNotifierTy>_>
  *in_stack_ffffffffffffffb8;
  _List_iterator<XPMP2::XPMPPlaneNotifierTy> in_stack_ffffffffffffffd8;
  XPMPPlaneNotifierTy local_20 [2];
  
  XPMP2::XPMPPlaneNotifierTy::XPMPPlaneNotifierTy(local_20,in_RDI,in_RSI);
  __last = std::__cxx11::
           list<XPMP2::XPMPPlaneNotifierTy,_std::allocator<XPMP2::XPMPPlaneNotifierTy>_>::begin
                     (in_stack_ffffffffffffffb8);
  __val = std::__cxx11::
          list<XPMP2::XPMPPlaneNotifierTy,_std::allocator<XPMP2::XPMPPlaneNotifierTy>_>::end
                    (in_stack_ffffffffffffffb8);
  std::find<std::_List_iterator<XPMP2::XPMPPlaneNotifierTy>,XPMP2::XPMPPlaneNotifierTy>
            (in_stack_ffffffffffffffd8,(_List_iterator<XPMP2::XPMPPlaneNotifierTy>)__last._M_node,
             (XPMPPlaneNotifierTy *)__val._M_node);
  this = std::__cxx11::list<XPMP2::XPMPPlaneNotifierTy,_std::allocator<XPMP2::XPMPPlaneNotifierTy>_>
         ::end(in_stack_ffffffffffffffb8);
  bVar1 = std::operator==((_Self *)&stack0xffffffffffffffd8,(_Self *)&stack0xffffffffffffffc0);
  if ((bVar1) &&
     (std::__cxx11::list<XPMP2::XPMPPlaneNotifierTy,_std::allocator<XPMP2::XPMPPlaneNotifierTy>_>::
      emplace_back<XPMP2::XPMPPlaneNotifierTy>
                ((list<XPMP2::XPMPPlaneNotifierTy,_std::allocator<XPMP2::XPMPPlaneNotifierTy>_> *)
                 __last._M_node,(XPMPPlaneNotifierTy *)__val._M_node), XPMP2::glob < 1)) {
    sVar2 = std::__cxx11::
            list<XPMP2::XPMPPlaneNotifierTy,_std::allocator<XPMP2::XPMPPlaneNotifierTy>_>::size
                      ((list<XPMP2::XPMPPlaneNotifierTy,_std::allocator<XPMP2::XPMPPlaneNotifierTy>_>
                        *)this._M_node);
    XPMP2::LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/XPMPMultiplayer.cpp"
                  ,0x223,"XPMPRegisterPlaneNotifierFunc",logDEBUG,"%lu observers registered",sVar2);
  }
  return;
}

Assistant:

void            XPMPRegisterPlaneNotifierFunc(XPMPPlaneNotifier_f       inFunc,
                                              void *                    inRefcon)
{
    // Avoid duplicate entries
    XPMPPlaneNotifierTy observer (inFunc, inRefcon);
    if (std::find(glob.listObservers.begin(),
                  glob.listObservers.end(),
                  observer) == glob.listObservers.end()) {
        glob.listObservers.emplace_back(std::move(observer));
        LOG_MSG(logDEBUG, "%lu observers registered",
                (unsigned long)glob.listObservers.size());
    }
}